

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O3

int Llb_NonlinQuantify1(Llb_Mgr_t *p,Llb_Prt_t *pPart,int fSubset)

{
  DdNode *pDVar1;
  Llb_Var_t *pVar;
  int *piVar2;
  Llb_Prt_t *pLVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  DdNode *pDVar8;
  DdNode *n;
  uint *__ptr;
  Vec_Int_t *pVVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  int Length;
  ulong local_40;
  int local_34;
  
  if (fSubset == 0) {
    pDVar8 = Llb_NonlinCreateCube1(p,pPart);
    Cudd_Ref(pDVar8);
    pDVar1 = pPart->bFunc;
    n = Cudd_bddExistAbstract(p->dd,pDVar1,pDVar8);
    pPart->bFunc = n;
    Cudd_Ref(n);
    Cudd_RecursiveDeref(p->dd,pDVar1);
    Cudd_RecursiveDeref(p->dd,pDVar8);
  }
  else {
    pDVar1 = pPart->bFunc;
    pDVar8 = Cudd_LargestCube(p->dd,pDVar1,&local_34);
    pPart->bFunc = pDVar8;
    Cudd_Ref(pDVar8);
    printf("Subsetting %3d : ",(ulong)(uint)pPart->iPart);
    uVar4 = Cudd_SupportSize(p->dd,pDVar1);
    uVar5 = Cudd_DagSize(pDVar1);
    printf("(Supp =%3d  Node =%5d) -> ",(ulong)uVar4,(ulong)uVar5);
    uVar4 = Cudd_SupportSize(p->dd,pPart->bFunc);
    uVar5 = Cudd_DagSize(pPart->bFunc);
    printf("(Supp =%3d  Node =%5d)\n",(ulong)uVar4,(ulong)uVar5);
    iVar6 = Cudd_DagSize(pDVar1);
    iVar7 = Cudd_DagSize(pPart->bFunc);
    Cudd_RecursiveDeref(p->dd,pDVar1);
    if (iVar6 == iVar7) {
      return 1;
    }
  }
  __ptr = (uint *)calloc(1,0x10);
  iVar6 = Cudd_DagSize(pPart->bFunc);
  Extra_SupportArray(p->dd,pPart->bFunc,p->pSupp);
  pVVar9 = pPart->vVars;
  if (pVVar9->nSize < 1) {
    uVar4 = 0;
  }
  else {
    local_40 = 0;
    uVar4 = 0;
    lVar12 = 0;
    do {
      pVar = p->pVars[pVVar9->pArray[lVar12]];
      pVVar9 = pVar->vParts;
      if (p->pSupp[pVar->iVar] == 0) {
        iVar7 = pVVar9->nSize;
        if ((long)iVar7 < 1) {
          if (iVar7 != 0) {
            __assert_fail("i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x3dc,"int Vec_IntRemove(Vec_Int_t *, int)");
          }
LAB_0083035f:
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                        ,0x136,"int Llb_NonlinQuantify1(Llb_Mgr_t *, Llb_Prt_t *, int)");
        }
        piVar2 = pVVar9->pArray;
        lVar11 = 1;
        while (piVar2[lVar11 + -1] != pPart->iPart) {
          bVar14 = lVar11 == iVar7;
          lVar11 = lVar11 + 1;
          if (bVar14) goto LAB_0083035f;
        }
        if ((int)lVar11 < iVar7) {
          do {
            piVar2[lVar11 + -1] = piVar2[lVar11];
            lVar11 = lVar11 + 1;
            iVar7 = pVVar9->nSize;
          } while ((int)lVar11 < iVar7);
        }
        pVVar9->nSize = iVar7 + -1;
        pVar->nScore = pVar->nScore - pPart->nSize;
        if (iVar7 == 1) {
          Llb_NonlinRemoveVar(p,pVar);
        }
        else if (iVar7 == 2) {
          pLVar3 = p->pParts[*piVar2];
          if (0 < (int)uVar4) {
            uVar13 = 0;
            do {
              if (*(Llb_Prt_t **)(*(long *)(__ptr + 2) + uVar13 * 8) == pLVar3) goto LAB_00830145;
              uVar13 = uVar13 + 1;
            } while (uVar4 != uVar13);
          }
          uVar5 = (uint)local_40;
          if (uVar4 == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar10 = malloc(0x80);
              }
              else {
                pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
              }
              *(void **)(__ptr + 2) = pvVar10;
              *__ptr = 0x10;
              local_40 = 0x10;
            }
            else {
              local_40 = (ulong)(uVar5 * 2);
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar10 = malloc(local_40 * 8);
              }
              else {
                pvVar10 = realloc(*(void **)(__ptr + 2),local_40 * 8);
              }
              *(void **)(__ptr + 2) = pvVar10;
              *__ptr = uVar5 * 2;
            }
          }
          else {
            pvVar10 = *(void **)(__ptr + 2);
          }
          lVar11 = (long)(int)uVar4;
          uVar4 = uVar4 + 1;
          __ptr[1] = uVar4;
          *(Llb_Prt_t **)((long)pvVar10 + lVar11 * 8) = pLVar3;
        }
      }
      else {
        if (pVVar9->nSize < 2) {
          __assert_fail("Vec_IntSize(pVar->vParts) > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                        ,0x130,"int Llb_NonlinQuantify1(Llb_Mgr_t *, Llb_Prt_t *, int)");
        }
        pVar->nScore = pVar->nScore + (iVar6 - pPart->nSize);
      }
LAB_00830145:
      lVar12 = lVar12 + 1;
      pVVar9 = pPart->vVars;
    } while (lVar12 < pVVar9->nSize);
  }
  pPart->nSize = iVar6;
  pVVar9->nSize = 0;
  iVar6 = p->nVars;
  if (0 < iVar6) {
    lVar12 = 0;
    do {
      if ((p->pSupp[lVar12] != 0) && (p->pVars2Q[lVar12] != 0)) {
        Vec_IntPush(pPart->vVars,(int)lVar12);
        iVar6 = p->nVars;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar6);
  }
  pvVar10 = *(void **)(__ptr + 2);
  if ((int)uVar4 < 1) {
    if (pvVar10 == (void *)0x0) goto LAB_00830323;
  }
  else {
    uVar13 = 0;
    do {
      Llb_NonlinQuantify1(p,*(Llb_Prt_t **)((long)pvVar10 + uVar13 * 8),0);
      uVar13 = uVar13 + 1;
    } while (uVar4 != uVar13);
  }
  free(pvVar10);
LAB_00830323:
  free(__ptr);
  return 0;
}

Assistant:

int Llb_NonlinQuantify1( Llb_Mgr_t * p, Llb_Prt_t * pPart, int fSubset )
{
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bTemp;
    int i, RetValue, nSizeNew;
    if ( fSubset )
    {        
        int Length;
//        int nSuppSize = Cudd_SupportSize( p->dd, pPart->bFunc );
//        pPart->bFunc = Cudd_SubsetHeavyBranch( p->dd, bTemp = pPart->bFunc, nSuppSize, 3*pPart->nSize/4 );  Cudd_Ref( pPart->bFunc );
        pPart->bFunc = Cudd_LargestCube( p->dd, bTemp = pPart->bFunc, &Length );  Cudd_Ref( pPart->bFunc );

        printf( "Subsetting %3d : ", pPart->iPart );
        printf( "(Supp =%3d  Node =%5d) -> ", Cudd_SupportSize(p->dd, bTemp),        Cudd_DagSize(bTemp) );
        printf( "(Supp =%3d  Node =%5d)\n",   Cudd_SupportSize(p->dd, pPart->bFunc), Cudd_DagSize(pPart->bFunc) );

        RetValue = (Cudd_DagSize(bTemp) == Cudd_DagSize(pPart->bFunc));

        Cudd_RecursiveDeref( p->dd, bTemp );

        if ( RetValue )
            return 1;
    }
    else
    {
        // create cube to be quantified
        bCube = Llb_NonlinCreateCube1( p, pPart );   Cudd_Ref( bCube );
//        assert( !Cudd_IsConstant(bCube) );
        // derive new function
        pPart->bFunc = Cudd_bddExistAbstract( p->dd, bTemp = pPart->bFunc, bCube );  Cudd_Ref( pPart->bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bCube );
    }
    // get support
    vSingles = Vec_PtrAlloc( 0 );
    nSizeNew = Cudd_DagSize(pPart->bFunc);
    Extra_SupportArray( p->dd, pPart->bFunc, p->pSupp );
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( p->pSupp[pVar->iVar] )
        {
            assert( Vec_IntSize(pVar->vParts) > 1 );
            pVar->nScore -= pPart->nSize - nSizeNew;
        }
        else
        {
            RetValue = Vec_IntRemove( pVar->vParts, pPart->iPart );
            assert( RetValue );
            pVar->nScore -= pPart->nSize;
            if ( Vec_IntSize(pVar->vParts) == 0 )
                Llb_NonlinRemoveVar( p, pVar );
            else if ( Vec_IntSize(pVar->vParts) == 1 )
                Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }

    // update partition
    pPart->nSize = nSizeNew;
    Vec_IntClear( pPart->vVars );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pSupp[i] && p->pVars2Q[i] )
            Vec_IntPush( pPart->vVars, i );
    // remove other variables
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
        Llb_NonlinQuantify1( p, pTemp, 0 );
    Vec_PtrFree( vSingles );
    return 0;
}